

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dom.cpp
# Opt level: O2

int __thiscall
crawler::Node::select
          (Node *this,int __nfds,fd_set *__readfds,fd_set *__writefds,fd_set *__exceptfds,
          timeval *__timeout)

{
  pointer pNVar1;
  char cVar2;
  Node *childrenNode;
  pointer pNVar3;
  undefined4 in_register_00000034;
  queue<crawler::Node,_std::deque<crawler::Node,_std::allocator<crawler::Node>_>_> queue;
  Node root;
  Node tempNode;
  vector<crawler::Node,_std::allocator<crawler::Node>_> local_1a8;
  queue<crawler::Node,_std::deque<crawler::Node,_std::allocator<crawler::Node>_>_> local_190;
  Node local_140;
  Node local_b8;
  
  (this->children).super__Vector_base<crawler::Node,_std::allocator<crawler::Node>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->children).super__Vector_base<crawler::Node,_std::allocator<crawler::Node>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->children).super__Vector_base<crawler::Node,_std::allocator<crawler::Node>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::queue<crawler::Node,std::deque<crawler::Node,std::allocator<crawler::Node>>>::
  queue<std::deque<crawler::Node,std::allocator<crawler::Node>>,void>(&local_190);
  Node(&local_140,(Node *)CONCAT44(in_register_00000034,__nfds));
  std::deque<crawler::Node,_std::allocator<crawler::Node>_>::push_back(&local_190.c,&local_140);
  while (local_190.c.super__Deque_base<crawler::Node,_std::allocator<crawler::Node>_>._M_impl.
         super__Deque_impl_data._M_finish._M_cur !=
         local_190.c.super__Deque_base<crawler::Node,_std::allocator<crawler::Node>_>._M_impl.
         super__Deque_impl_data._M_start._M_cur) {
    Node(&local_b8,
         local_190.c.super__Deque_base<crawler::Node,_std::allocator<crawler::Node>_>._M_impl.
         super__Deque_impl_data._M_start._M_cur);
    std::deque<crawler::Node,_std::allocator<crawler::Node>_>::pop_front(&local_190.c);
    if (local_b8.nodeType == Element) {
      cVar2 = (**(code **)__readfds->fds_bits[0])(__readfds,&local_b8);
      if (cVar2 != '\0') {
        std::vector<crawler::Node,std::allocator<crawler::Node>>::emplace_back<crawler::Node&>
                  ((vector<crawler::Node,std::allocator<crawler::Node>> *)this,&local_b8);
      }
    }
    std::vector<crawler::Node,_std::allocator<crawler::Node>_>::vector
              (&local_1a8,&local_b8.children);
    pNVar3 = local_1a8.super__Vector_base<crawler::Node,_std::allocator<crawler::Node>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pNVar1 = local_1a8.super__Vector_base<crawler::Node,_std::allocator<crawler::Node>_>._M_impl.
             super__Vector_impl_data._M_start;
    std::vector<crawler::Node,_std::allocator<crawler::Node>_>::~vector(&local_1a8);
    if (pNVar1 != pNVar3) {
      std::vector<crawler::Node,_std::allocator<crawler::Node>_>::vector
                (&local_1a8,&local_b8.children);
      pNVar1 = local_1a8.super__Vector_base<crawler::Node,_std::allocator<crawler::Node>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (pNVar3 = local_1a8.super__Vector_base<crawler::Node,_std::allocator<crawler::Node>_>.
                    _M_impl.super__Vector_impl_data._M_start; pNVar3 != pNVar1; pNVar3 = pNVar3 + 1)
      {
        std::deque<crawler::Node,_std::allocator<crawler::Node>_>::push_back(&local_190.c,pNVar3);
      }
      std::vector<crawler::Node,_std::allocator<crawler::Node>_>::~vector(&local_1a8);
    }
    ~Node(&local_b8);
  }
  ~Node(&local_140);
  std::deque<crawler::Node,_std::allocator<crawler::Node>_>::~deque(&local_190.c);
  return (int)this;
}

Assistant:

crawler::Nodes crawler::Node::select(Evaluator *evaluator) {
  return getElementsByPredicate([&evaluator](const Node &node) -> bool {
    return evaluator->matches(node);
  });
}